

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
ObjNoTest_UseFirstObjByDefault_Test::TestBody(ObjNoTest_UseFirstObjByDefault_Test *this)

{
  bool bVar1;
  SolverOption *pSVar2;
  char ***pppcVar3;
  char *message;
  longlong value;
  AssertionResult gtest_ar;
  SolverApp<TestSolver,_TestNLReader> app;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  AssertHelper local_508;
  int local_4fc;
  Args local_4f8;
  SolverApp<TestSolver,_TestNLReader> local_4b8;
  
  mp::SolverApp<TestSolver,_TestNLReader>::SolverApp(&local_4b8);
  local_4fc = 1;
  pSVar2 = mp::SolverOptionManager::GetOption
                     (&local_4b8.solver_.super_Solver.super_BasicSolver.super_SolverOptionManager,
                      "objno");
  local_510.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (*pSVar2->_vptr_SolverOption[3])(pSVar2);
  local_508.data_ = (AssertHelperData *)local_510.ptr_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_4f8,"1","app.solver().GetIntOption(\"objno\")",&local_4fc,
             (longlong *)&local_508);
  if ((char)local_4f8.argc_ == '\0') {
    testing::Message::Message((Message *)&local_510);
    if (local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x685,message);
    testing::internal::AssertHelper::operator=(&local_508,(Message *)&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    if ((AssertHelperData *)local_510.ptr_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_510.ptr_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_510.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_4f8.store_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Args::Args(&local_4f8,"test","testproblem",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  pppcVar3 = Args::operator_cast_to_char___(&local_4f8);
  mp::SolverApp<TestSolver,_TestNLReader>::Run(&local_4b8,*pppcVar3,0);
  if (local_4f8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4f8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f8.store_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mp::SolverApp<TestSolver,_TestNLReader>::~SolverApp(&local_4b8);
  return;
}

Assistant:

TEST(ObjNoTest, UseFirstObjByDefault) {
  mp::SolverApp<TestSolver, TestNLReader> app;
  EXPECT_EQ(1, app.solver().GetIntOption("objno"));
  app.Run(Args("test", "testproblem"));
}